

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall
Memory::HeapInfo::EnumerateObjects
          (HeapInfo *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  _func_void_void_ptr_size_t *CallBackFunction_local;
  ObjectInfoBits infoBits_local;
  HeapInfo *this_local;
  
  for (local_24 = 0; local_24 < 0x30; local_24 = local_24 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::EnumerateObjects
              (this->heapBuckets + local_24,infoBits,CallBackFunction);
  }
  for (local_28 = 0; local_28 < 0x1d; local_28 = local_28 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::EnumerateObjects
              (this->mediumHeapBuckets + local_28,infoBits,CallBackFunction);
  }
  LargeHeapBucket::EnumerateObjects(&this->largeObjectBucket,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
            (this->newLeafHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
            (this->newNormalHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::
  EnumerateObjects<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (this->newNormalWithBarrierHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::
  EnumerateObjects<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (this->newFinalizableWithBarrierHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (this->newFinalizableHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
            (this->newMediumLeafHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
            (this->newMediumNormalHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::
  EnumerateObjects<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (this->newMediumNormalWithBarrierHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::
  EnumerateObjects<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (this->newMediumFinalizableWithBarrierHeapBlockList,infoBits,CallBackFunction);
  HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
            (this->newMediumFinalizableHeapBlockList,infoBits,CallBackFunction);
  return;
}

Assistant:

void
HeapInfo::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].EnumerateObjects(infoBits, CallBackFunction);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].EnumerateObjects(infoBits, CallBackFunction);
    }
#endif

    largeObjectBucket.EnumerateObjects(infoBits, CallBackFunction);

#if ENABLE_CONCURRENT_GC
    HeapBucket::EnumerateObjects(newLeafHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newNormalHeapBlockList, infoBits, CallBackFunction);
#ifdef RECYCLER_WRITE_BARRIER
    HeapBucket::EnumerateObjects(newNormalWithBarrierHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newFinalizableWithBarrierHeapBlockList, infoBits, CallBackFunction);
#endif

#ifdef RECYCLER_VISITED_HOST
    HeapBucket::EnumerateObjects(newRecyclerVisitedHostHeapBlockList, infoBits, CallBackFunction);
#endif
    HeapBucket::EnumerateObjects(newFinalizableHeapBlockList, infoBits, CallBackFunction);

    HeapBucket::EnumerateObjects(newMediumLeafHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newMediumNormalHeapBlockList, infoBits, CallBackFunction);
#ifdef RECYCLER_WRITE_BARRIER
    HeapBucket::EnumerateObjects(newMediumNormalWithBarrierHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newMediumFinalizableWithBarrierHeapBlockList, infoBits, CallBackFunction);
#endif

#ifdef RECYCLER_VISITED_HOST
    HeapBucket::EnumerateObjects(newMediumRecyclerVisitedHostHeapBlockList, infoBits, CallBackFunction);
#endif
    HeapBucket::EnumerateObjects(newMediumFinalizableHeapBlockList, infoBits, CallBackFunction);
#endif
}